

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O3

btree_result btree_iterator_free(btree_iterator *it)

{
  btree_print_func *pbVar1;
  ushort uVar2;
  ulong uVar3;
  
  pbVar1 = ((it->btree).kv_ops)->free_kv_var;
  if (pbVar1 != (btree_print_func *)0x0) {
    (*pbVar1)(&it->btree,it->curkey,(void *)0x0);
  }
  free(it->curkey);
  free(it->bid);
  free(it->idx);
  uVar2 = (it->btree).height;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if (it->node[uVar3] != (bnode *)0x0) {
        free(it->addr[uVar3]);
        uVar2 = (it->btree).height;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  free(it->node);
  free(it->addr);
  return BTREE_RESULT_SUCCESS;
}

Assistant:

btree_result btree_iterator_free(struct btree_iterator *it)
{
    int i;
    if (it->btree.kv_ops->free_kv_var) {
        it->btree.kv_ops->free_kv_var(&it->btree, it->curkey, NULL);
    }
    mempool_free(it->curkey);
    mempool_free(it->bid);
    mempool_free(it->idx);
    for (i=0;i<it->btree.height;++i){
        if (it->node[i]) mempool_free(it->addr[i]);
    }
    mempool_free(it->node);
    mempool_free(it->addr);
    return BTREE_RESULT_SUCCESS;
}